

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubDComponentList::Internal_Create
          (ON_SubDComponentList *this,ON_SubD *subd,bool bAddVertices,bool bAddEdges,bool bAddFaces,
          bool bComponentInListMark,uint marked_component_count)

{
  ON_SimpleArray<ON_SubDComponentPtr> *this_00;
  element_type *peVar1;
  ON_SubDimple *pOVar2;
  bool bVar3;
  int iVar4;
  ON_SubDLevel *pOVar5;
  ON_SubDVertex *pOVar6;
  ON__UINT64 OVar7;
  ulong uVar8;
  uint uVar9;
  ON_SubDVertexIterator vit;
  ON_SubDComponentPtr local_88;
  ulong local_80;
  ulong local_78;
  ON_SubD *local_70;
  ON_SubDEdgeIterator local_68;
  
  this->m_subd_runtime_serial_number = 0;
  this->m_subd_geometry_content_serial_number = 0;
  this->m_subd_render_content_serial_number = 0;
  if (-1 < (this->m_component_list).m_capacity) {
    (this->m_component_list).m_count = 0;
  }
  local_70 = &this->m_subd;
  ON_SubD::ShareDimple(local_70,&ON_SubD::Empty);
  if (marked_component_count == 0) {
    return 0;
  }
  uVar8 = 0;
  local_78 = 0;
  if (bAddFaces) {
    peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (pOVar5 = peVar1->m_active_level, pOVar5 == (ON_SubDLevel *)0x0)) {
      pOVar5 = &ON_SubDLevel::Empty;
    }
    local_78 = (ulong)pOVar5->m_face_count;
  }
  if (bAddEdges) {
    peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (pOVar5 = peVar1->m_active_level, pOVar5 == (ON_SubDLevel *)0x0)) {
      pOVar5 = &ON_SubDLevel::Empty;
    }
    uVar8 = (ulong)pOVar5->m_edge_count;
  }
  uVar9 = 0;
  if (bAddVertices) {
    peVar1 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (pOVar5 = peVar1->m_active_level, pOVar5 == (ON_SubDLevel *)0x0)) {
      pOVar5 = &ON_SubDLevel::Empty;
    }
    uVar9 = pOVar5->m_vertex_count;
  }
  if (((int)uVar8 == 0 && (int)local_78 == 0) && uVar9 == 0) {
    return 0;
  }
  if ((int)uVar8 + (int)local_78 + uVar9 < marked_component_count) {
    return 0;
  }
  this_00 = &this->m_component_list;
  iVar4 = (this->m_component_list).m_capacity;
  if ((ulong)(long)iVar4 < (ulong)marked_component_count) {
    ON_SimpleArray<ON_SubDComponentPtr>::SetCapacity(this_00,(ulong)marked_component_count);
    iVar4 = (this->m_component_list).m_capacity;
  }
  if (-1 < iVar4) {
    (this->m_component_list).m_count = 0;
  }
  if (uVar9 != 0) {
    local_80 = uVar8;
    ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&local_68,subd);
    local_68.m_edge_index = 0;
    local_68.m_e_current = local_68.m_e_first;
    if ((ON_SubDVertex *)local_68.m_e_first != (ON_SubDVertex *)0x0) {
      pOVar6 = (ON_SubDVertex *)local_68.m_e_first;
      do {
        bVar3 = ON_ComponentStatus::RuntimeMark(&(pOVar6->super_ON_SubDComponentBase).m_status);
        if (bVar3 == bComponentInListMark) {
          local_88.m_ptr = (ulong)pOVar6 | 2;
          ON_SimpleArray<ON_SubDComponentPtr>::Append(this_00,&local_88);
        }
        pOVar6 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&local_68);
      } while (pOVar6 != (ON_SubDVertex *)0x0);
    }
    ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
    uVar8 = local_80;
  }
  if ((int)uVar8 != 0) {
    ON_SubDEdgeIterator::ON_SubDEdgeIterator(&local_68,subd);
    local_68.m_edge_index = 0;
    local_68.m_e_current = local_68.m_e_first;
    if ((ON_SubDVertex *)local_68.m_e_first != (ON_SubDVertex *)0x0) {
      pOVar6 = (ON_SubDVertex *)local_68.m_e_first;
      do {
        bVar3 = ON_ComponentStatus::RuntimeMark(&(pOVar6->super_ON_SubDComponentBase).m_status);
        if (bVar3 == bComponentInListMark) {
          local_88.m_ptr = (ulong)pOVar6 | 4;
          ON_SimpleArray<ON_SubDComponentPtr>::Append(this_00,&local_88);
        }
        pOVar6 = (ON_SubDVertex *)ON_SubDEdgeIterator::NextEdge(&local_68);
      } while (pOVar6 != (ON_SubDVertex *)0x0);
    }
    ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
  }
  if ((int)local_78 != 0) {
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&local_68,subd);
    local_68.m_edge_index = 0;
    local_68.m_e_current = local_68.m_e_first;
    if ((ON_SubDVertex *)local_68.m_e_first != (ON_SubDVertex *)0x0) {
      pOVar6 = (ON_SubDVertex *)local_68.m_e_first;
      do {
        bVar3 = ON_ComponentStatus::RuntimeMark(&(pOVar6->super_ON_SubDComponentBase).m_status);
        if (bVar3 == bComponentInListMark) {
          local_88.m_ptr = (ulong)pOVar6 | 6;
          ON_SimpleArray<ON_SubDComponentPtr>::Append(this_00,&local_88);
        }
        pOVar6 = (ON_SubDVertex *)ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&local_68);
      } while (pOVar6 != (ON_SubDVertex *)0x0);
    }
    ON_SubDRef::~ON_SubDRef(&local_68.m_subd_ref);
  }
  if ((this->m_component_list).m_count == 0) {
    return 0;
  }
  ON_SubD::ShareDimple(local_70,subd);
  pOVar2 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (pOVar2 == (ON_SubDimple *)0x0) {
    this->m_subd_runtime_serial_number = 0;
    this->m_subd_geometry_content_serial_number = 0;
  }
  else {
    this->m_subd_runtime_serial_number = pOVar2->RuntimeSerialNumber;
    OVar7 = ON_SubDimple::GeometryContentSerialNumber(pOVar2);
    pOVar2 = (subd->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    this->m_subd_geometry_content_serial_number = OVar7;
    if (pOVar2 != (ON_SubDimple *)0x0) {
      OVar7 = ON_SubDimple::RenderContentSerialNumber(pOVar2);
      goto LAB_005ef403;
    }
  }
  OVar7 = 0;
LAB_005ef403:
  this->m_subd_render_content_serial_number = OVar7;
  return (this->m_component_list).m_count;
}

Assistant:

unsigned ON_SubDComponentList::Internal_Create(const ON_SubD & subd, bool bAddVertices, bool bAddEdges, bool bAddFaces, bool bComponentInListMark, unsigned marked_component_count)
{
  Destroy();

  if (0 == marked_component_count)
    return 0;

  const unsigned face_count = bAddFaces ? subd.FaceCount() : 0U;
  const unsigned edge_count = bAddEdges ? subd.EdgeCount() : 0U;
  const unsigned vertex_count = bAddVertices ? subd.VertexCount() : 0U;
  if (0 == vertex_count && 0 == edge_count && 0 == face_count)
    return 0;

  if (marked_component_count > vertex_count + edge_count + face_count)
    return 0;

  bComponentInListMark = bComponentInListMark ? true : false;
  m_component_list.Reserve(marked_component_count);
  m_component_list.SetCount(0);
  if (vertex_count > 0)
  {
    ON_SubDVertexIterator vit(subd);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (bComponentInListMark != v->m_status.RuntimeMark())
        continue;
      m_component_list.Append(v->ComponentPtr());
    }
  }
  if (edge_count > 0)
  {
    ON_SubDEdgeIterator eit(subd);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (bComponentInListMark != e->m_status.RuntimeMark())
        continue;
      m_component_list.Append(e->ComponentPtr());
    }
  }
  if (face_count > 0)
  {
    ON_SubDFaceIterator fit(subd);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (bComponentInListMark != f->m_status.RuntimeMark())
        continue;
      m_component_list.Append(f->ComponentPtr());
    }
  }

  if (m_component_list.UnsignedCount() > 0)
  {
    m_subd.ShareDimple(subd);
    m_subd_runtime_serial_number = subd.RuntimeSerialNumber();
    m_subd_geometry_content_serial_number = subd.GeometryContentSerialNumber();
    m_subd_render_content_serial_number = subd.RenderContentSerialNumber();
  }
  return m_component_list.UnsignedCount();
}